

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# badguys.c
# Opt level: O1

void draw_badguys(int r,int g,int b,_func_int_float_ptr_int_ptr_int *project)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  BADGUY *pBVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ALLEGRO_COLOR AVar5;
  int ishape [12];
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  int local_58 [14];
  
  pBVar4 = evildudes;
  AVar5 = makecol(r,g,b);
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_8_ = AVar5._0_8_;
  local_68._12_4_ = extraout_XMM0_Dd;
  local_78._8_4_ = in_XMM1_Dc;
  local_78._0_8_ = AVar5._8_8_;
  local_78._12_4_ = in_XMM1_Dd;
  if (pBVar4 != (BADGUY *)0x0) {
    do {
      if (0.0 < pBVar4->y) {
        local_a8 = CONCAT44(pBVar4->y + 0.01,pBVar4->x + -0.02);
        local_a0 = pBVar4->x;
        local_9c = pBVar4->y + 0.02;
        local_98 = pBVar4->x + 0.02;
        local_94 = pBVar4->y + 0.01;
        local_90 = pBVar4->x + 0.01;
        local_8c = pBVar4->y + 0.005;
        local_88 = pBVar4->x;
        local_84 = pBVar4->y + -0.015;
        local_80 = pBVar4->x + -0.01;
        local_7c = pBVar4->y + 0.005;
        iVar3 = (*project)((float *)&local_a8,local_58,0xc);
        auVar2 = local_68;
        auVar1 = local_78;
        if (iVar3 != 0) {
          AVar5.b = (float)local_78._0_4_;
          AVar5.a = (float)local_78._4_4_;
          AVar5.r = (float)local_68._0_4_;
          AVar5.g = (float)local_68._4_4_;
          local_78 = auVar1;
          local_68 = auVar2;
          polygon(6,local_58,AVar5);
        }
      }
      pBVar4 = pBVar4->next;
    } while (pBVar4 != (BADGUY *)0x0);
  }
  return;
}

Assistant:

void draw_badguys(int r, int g, int b, int (*project)(float *f, int *i, int c))
{
   BADGUY *bad = evildudes;
   ALLEGRO_COLOR c = makecol(r, g, b);
   float shape[12];
   int ishape[12];

   while (bad) {
      if (bad->y > 0) {
	 shape[0] = bad->x - 0.02;
	 shape[1] = bad->y + 0.01;

	 shape[2] = bad->x;
	 shape[3] = bad->y + 0.02;

	 shape[4] = bad->x + 0.02;
	 shape[5] = bad->y + 0.01;

	 shape[6] = bad->x + 0.01;
	 shape[7] = bad->y + 0.005;

	 shape[8] = bad->x;
	 shape[9] = bad->y - 0.015;

	 shape[10] = bad->x - 0.01;
	 shape[11] = bad->y + 0.005;

	 if (project(shape, ishape, 12))
	    polygon(6, ishape, c);
      }

      bad = bad->next;
   }
}